

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall duckdb::StorageManager::Initialize(StorageManager *this,StorageOptions options)

{
  bool bVar1;
  CatalogException *this_00;
  allocator local_39;
  string local_38;
  
  bVar1 = InMemory(this);
  if ((bVar1) && (this->read_only == true)) {
    this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Cannot launch in-memory database in read-only mode!",&local_39);
    CatalogException::CatalogException(this_00,&local_38);
    __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (*this->_vptr_StorageManager[10])(this);
  return;
}

Assistant:

void StorageManager::Initialize(StorageOptions options) {
	bool in_memory = InMemory();
	if (in_memory && read_only) {
		throw CatalogException("Cannot launch in-memory database in read-only mode!");
	}

	// Create or load the database from disk, if not in-memory mode.
	LoadDatabase(options);
}